

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdir.cpp
# Opt level: O0

int __thiscall QDir::rename(QDir *this,char *__old,char *__new)

{
  bool bVar1;
  int iVar2;
  char *__new_00;
  long in_FS_OFFSET;
  QFile file;
  char *in_stack_ffffffffffffff48;
  int in_stack_ffffffffffffff54;
  char *in_stack_ffffffffffffff58;
  undefined4 in_stack_ffffffffffffff68;
  undefined4 in_stack_ffffffffffffff6c;
  QFile *in_stack_ffffffffffffff70;
  byte local_69;
  char local_68 [16];
  QString *in_stack_ffffffffffffffa8;
  QDir *in_stack_ffffffffffffffb0;
  QFile local_38;
  QMessageLogger local_28;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  bVar1 = QString::isEmpty((QString *)0x281b8f);
  if (!bVar1) {
    bVar1 = QString::isEmpty((QString *)0x281b9d);
    if (!bVar1) {
      local_38.super_QFileDevice.super_QIODevice.super_QObject._vptr_QObject =
           (_func_int **)&DAT_aaaaaaaaaaaaaaaa;
      local_38.super_QFileDevice.super_QIODevice.super_QObject.d_ptr.d =
           (QObjectData *)&DAT_aaaaaaaaaaaaaaaa;
      filePath(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
      QFile::QFile(in_stack_ffffffffffffff70,
                   (QString *)CONCAT44(in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68));
      QString::~QString((QString *)0x281c1f);
      bVar1 = QFile::exists((QFile *)this);
      if (bVar1) {
        filePath(in_stack_ffffffffffffffb0,in_stack_ffffffffffffffa8);
        iVar2 = QFile::rename(&local_38,local_68,__new_00);
        local_69 = (byte)iVar2 & 1;
        QString::~QString((QString *)0x281cc5);
      }
      else {
        local_69 = 0;
      }
      QFile::~QFile((QFile *)0x281cfa);
      goto LAB_00281d0b;
    }
  }
  QMessageLogger::QMessageLogger
            ((QMessageLogger *)this,in_stack_ffffffffffffff58,in_stack_ffffffffffffff54,
             in_stack_ffffffffffffff48);
  QMessageLogger::warning(&local_28,"QDir::rename: Empty or null file name(s)");
  local_69 = 0;
LAB_00281d0b:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (int)CONCAT71((int7)((ulong)*(long *)(in_FS_OFFSET + 0x28) >> 8),local_69);
  }
  __stack_chk_fail();
}

Assistant:

bool QDir::rename(const QString &oldName, const QString &newName)
{
    if (oldName.isEmpty() || newName.isEmpty()) {
        qWarning("QDir::rename: Empty or null file name(s)");
        return false;
    }

    QFile file(filePath(oldName));
    if (!file.exists())
        return false;
    return file.rename(filePath(newName));
}